

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O2

uchar * read_win_rectangle(uchar *p,int X,int Y,int w,int h,int alpha)

{
  byte bVar1;
  Visual *pVVar2;
  int iVar3;
  uint3 uVar4;
  unsigned_long uVar5;
  ushort uVar6;
  Fl_Window *pFVar7;
  void *__ptr;
  int *piVar8;
  long lVar9;
  undefined8 uVar10;
  uchar *__s;
  unsigned_short *puVar11;
  uint uVar12;
  XColor *pXVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uchar uVar17;
  int iVar18;
  uint uVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  unsigned_long uVar23;
  uint *puVar24;
  undefined2 *puVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  byte *pbVar29;
  int iVar30;
  int iVar31;
  uchar uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  uchar *puVar36;
  bool bVar37;
  int iStack_13098;
  ulong uStack_13070;
  int sh;
  int sw;
  int dy;
  uchar *puStack_13058;
  XVisualInfo *pXStack_13050;
  ulong uStack_13048;
  int sy;
  int sx;
  uchar cvals [4096] [3];
  XColor colors [4096];
  
  iVar34 = -w;
  iVar31 = w;
  if (w < 1) {
    iVar31 = iVar34;
  }
  puStack_13058 = p;
  if ((w < 0) || (pFVar7 = fl_find(fl_window), pFVar7 != (Fl_Window *)0x0)) {
    XTranslateCoordinates
              (fl_display,fl_window,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),X,Y,
               cvals,&dy,colors);
    Fl::screen_xywh(&sx,&sy,&sw,&sh,fl_screen);
    if ((sx <= (int)cvals._0_4_) &&
       (((sy <= dy && (cvals._0_4_ + iVar31 <= sw + sx)) && (dy + h <= sh + sy))))
    goto LAB_001ebac1;
    iVar35 = sx;
    if (cvals._0_4_ - sx != 0 && sx <= (int)cvals._0_4_) {
      iVar35 = cvals._0_4_;
    }
    iVar14 = -(cvals._0_4_ - sx);
    if (sx <= (int)cvals._0_4_) {
      iVar14 = 0;
    }
    iVar18 = (sw + sx) - iVar35;
    if ((iVar31 - iVar14) + iVar35 <= sw + sx) {
      iVar18 = iVar31 - iVar14;
    }
    iVar35 = sy;
    if (dy - sy != 0 && sy <= dy) {
      iVar35 = dy;
    }
    iVar30 = -(dy - sy);
    if (sy <= dy) {
      iVar30 = 0;
    }
    iVar3 = (sy + sh) - iVar35;
    if ((h - iVar30) + iVar35 <= sy + sh) {
      iVar3 = h - iVar30;
    }
    if (iVar18 < 1) {
      return (uchar *)0x0;
    }
    if (iVar3 < 1) {
      return (uchar *)0x0;
    }
    pXStack_13050 = fl_visual;
    uVar19 = fl_visual->depth;
    uStack_13048 = (ulong)uVar19;
    iVar35 = uVar19 + (int)((long)((ulong)(uint)((int)((long)(int)uVar19 / 8) >> 0x1f) << 0x20 |
                                  (long)(int)uVar19 / 8 & 0xffffffffU) % 2) * 8;
    uVar15 = 0;
    __ptr = malloc((long)(iVar31 * h * (iVar35 / 8)));
    piVar8 = (int *)XCreateImage(fl_display,pXStack_13050->visual,uStack_13048,2,0,__ptr,iVar31,h,
                                 iVar35,uVar15 & 0xffffffff00000000);
    if (piVar8 == (int *)0x0) {
      free(__ptr);
      return (uchar *)0x0;
    }
    pXStack_13050 = (XVisualInfo *)XSetErrorHandler(xgetimageerrhandler);
    lVar9 = XGetSubImage(fl_display,fl_window,X + iVar14,Y + iVar30,iVar18,iVar3,0xffffffffffffffff,
                         2,piVar8,iVar14,iVar30);
    XSetErrorHandler(pXStack_13050);
    if (lVar9 == 0) {
      (**(code **)(piVar8 + 0x18))(piVar8);
      return (uchar *)0x0;
    }
  }
  else {
LAB_001ebac1:
    uVar10 = XSetErrorHandler(xgetimageerrhandler);
    piVar8 = (int *)XGetImage(fl_display,fl_window,X,Y,iVar31,h);
    XSetErrorHandler(uVar10);
    if (piVar8 == (int *)0x0) {
      return (uchar *)0x0;
    }
  }
  uVar19 = 4 - (alpha == 0);
  uVar15 = (ulong)(int)(iVar31 * h * uVar19);
  __s = puStack_13058;
  if (puStack_13058 == (uchar *)0x0) {
    __s = (uchar *)operator_new__(uVar15);
  }
  memset(__s,alpha,uVar15);
  uVar23 = *(unsigned_long *)(piVar8 + 0xe);
  puStack_13058 = __s;
  if (uVar23 == 0) {
    if (0xc < piVar8[0xc]) {
      pVVar2 = fl_visual->visual;
      uVar23 = pVVar2->red_mask;
      uVar5 = pVVar2->green_mask;
      *(unsigned_long *)(piVar8 + 0xe) = pVVar2->red_mask;
      *(unsigned_long *)(piVar8 + 0x10) = uVar5;
      *(unsigned_long *)(piVar8 + 0x12) = pVVar2->blue_mask;
      if (uVar23 != 0) goto LAB_001ebb73;
    }
    uVar33 = fl_visual->visual->map_entries;
    uVar15 = 0;
    uVar16 = 0;
    if (0 < (int)uVar33) {
      uVar16 = (ulong)uVar33;
    }
    pXVar13 = colors;
    for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pXVar13->pixel = uVar15;
      pXVar13 = pXVar13 + 1;
    }
    XQueryColors(fl_display,fl_colormap,colors);
    puVar11 = &colors[0].blue;
    for (lVar9 = 0; uVar16 * 3 != lVar9; lVar9 = lVar9 + 3) {
      cvals[0][lVar9] = *(uchar *)((long)puVar11 + -3);
      cvals[0][lVar9 + 1] = *(uchar *)((long)puVar11 + -1);
      cvals[0][lVar9 + 2] = *(uchar *)((long)puVar11 + 1);
      puVar11 = puVar11 + 8;
    }
    if (iVar34 < w) {
      iVar34 = w;
    }
    uVar15 = 0;
    for (lVar9 = 0; lVar9 < piVar8[1]; lVar9 = lVar9 + 1) {
      if (piVar8[0xc] - 1U < 0xc) {
        pbVar29 = (byte *)((long)(int)lVar9 * (long)piVar8[0xb] + *(long *)(piVar8 + 4));
        switch(piVar8[0xc]) {
        case 1:
          puVar36 = __s + uVar15 + 2;
          uVar33 = 0x80;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            if ((uVar33 & *pbVar29) == 0) {
              puVar36[-1] = cvals[0][1];
              uVar17 = cvals[0][0];
              uVar32 = cvals[0][2];
            }
            else {
              puVar36[-1] = cvals[1][1];
              uVar17 = cvals[1][0];
              uVar32 = cvals[1][2];
            }
            pbVar29 = pbVar29 + (uVar33 < 2);
            bVar37 = uVar33 < 2;
            puVar36[-2] = uVar17;
            uVar33 = uVar33 >> 1;
            if (bVar37) {
              uVar33 = 0x80;
            }
            *puVar36 = uVar32;
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 2:
          puVar36 = __s + uVar15 + 2;
          iVar35 = 6;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            uVar33 = *pbVar29 >> ((byte)iVar35 & 0x1f) & 3;
            puVar36[-2] = cvals[uVar33][0];
            puVar36[-1] = cvals[uVar33][1];
            *puVar36 = cvals[uVar33][2];
            bVar37 = iVar35 == 0;
            iVar35 = iVar35 + -2;
            if (bVar37) {
              iVar35 = 6;
            }
            pbVar29 = pbVar29 + bVar37;
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 4:
          puVar36 = __s + uVar15 + 2;
          bVar37 = true;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            bVar37 = !bVar37;
            bVar20 = *pbVar29 >> 4;
            if (bVar37) {
              bVar20 = *pbVar29 & 0xf;
            }
            puVar36[-2] = cvals[bVar20][0];
            puVar36[-1] = cvals[bVar20][1];
            *puVar36 = cvals[bVar20][2];
            pbVar29 = pbVar29 + bVar37;
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 8:
          puVar36 = __s + uVar15 + 2;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            puVar36[-2] = cvals[*pbVar29][0];
            puVar36[-1] = cvals[*pbVar29][1];
            *puVar36 = cvals[*pbVar29][2];
            pbVar29 = pbVar29 + 1;
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 0xc:
          puVar36 = __s + uVar15 + 2;
          bVar37 = false;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            if (bVar37) {
              uVar16 = (ulong)((pbVar29[1] & 0xf) << 8) | (ulong)pbVar29[2];
              lVar26 = 3;
            }
            else {
              uVar16 = (ulong)((uint)(pbVar29[1] >> 4) | (uint)*pbVar29 << 4);
              lVar26 = 0;
            }
            bVar37 = !bVar37;
            puVar36[-2] = cvals[uVar16][0];
            puVar36[-1] = cvals[uVar16][1];
            *puVar36 = cvals[uVar16][2];
            pbVar29 = pbVar29 + lVar26;
            puVar36 = puVar36 + uVar19;
          }
        }
      }
      uVar15 = (ulong)((int)uVar15 + uVar19 * iVar34);
    }
  }
  else {
LAB_001ebb73:
    bVar20 = 0;
    for (; uVar33 = (uint)uVar23, (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 & 0x7fffffff) {
      bVar20 = bVar20 + 1;
    }
    bVar21 = 0;
    for (uVar27 = piVar8[0x10]; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1) {
      bVar21 = bVar21 + 1;
    }
    bVar22 = 0;
    for (uVar28 = piVar8[0x12]; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1) {
      bVar22 = bVar22 + 1;
    }
    if (iVar34 < w) {
      iVar34 = w;
    }
    uStack_13070 = 0;
    for (lVar9 = 0; lVar9 < piVar8[1]; lVar9 = lVar9 + 1) {
      uVar12 = piVar8[0xc] << 0x1e | piVar8[0xc] - 8U >> 2;
      if (uVar12 < 7) {
        lVar26 = *(long *)(piVar8 + 4);
        iVar31 = piVar8[0xb];
        iStack_13098 = (int)lVar9;
        puVar24 = (uint *)(iVar31 * iStack_13098 + lVar26);
        switch(uVar12) {
        case 0:
          puVar36 = __s + uStack_13070 + 2;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            bVar1 = (byte)*puVar24;
            puVar36[-2] = (uchar)((ulong)((bVar1 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                 (uVar23 & 0xffffffff));
            puVar36[-1] = (uchar)(((bVar1 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
            *puVar36 = (uchar)(((bVar1 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
            puVar24 = (uint *)((long)puVar24 + 1);
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 1:
          puVar36 = __s + uStack_13070 + 2;
          bVar37 = false;
          for (iVar31 = *piVar8; 0 < iVar31; iVar31 = iVar31 + -1) {
            if (bVar37) {
              uVar12 = (*(byte *)((long)puVar24 + 1) & 0xf) << 8 |
                       (uint)*(byte *)((long)puVar24 + 2);
              lVar26 = 3;
            }
            else {
              uVar12 = (uint)(*(byte *)((long)puVar24 + 1) >> 4) | (uint)(byte)*puVar24 << 4;
              lVar26 = 0;
            }
            bVar37 = !bVar37;
            puVar36[-2] = (uchar)((ulong)((uVar12 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                 (uVar23 & 0xffffffff));
            puVar36[-1] = (uchar)(((uVar12 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
            *puVar36 = (uchar)(((uVar12 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
            puVar24 = (uint *)((long)puVar24 + lVar26);
            puVar36 = puVar36 + uVar19;
          }
          break;
        case 2:
          iVar35 = *piVar8;
          if (piVar8[6] == 0) {
            puVar36 = __s + uStack_13070 + 2;
            lVar26 = lVar26 + iVar31 * iStack_13098 + 1;
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              uVar6 = *(ushort *)(lVar26 + -1);
              puVar36[-2] = (uchar)((ulong)((uVar6 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)(((uVar6 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)(((uVar6 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar36 = puVar36 + uVar19;
              lVar26 = lVar26 + 2;
            }
          }
          else {
            puVar36 = __s + uStack_13070 + 2;
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              uVar6 = (ushort)*puVar24 << 8 | (ushort)*puVar24 >> 8;
              puVar36[-2] = (uchar)((ulong)((uVar6 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)(((uVar6 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)(((uVar6 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar24 = (uint *)((long)puVar24 + 2);
              puVar36 = puVar36 + uVar19;
            }
          }
          break;
        case 4:
          iVar35 = *piVar8;
          if (piVar8[6] == 0) {
            puVar36 = __s + uStack_13070 + 2;
            puVar25 = (undefined2 *)(lVar26 + iVar31 * iStack_13098 + 1);
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              uVar4 = CONCAT21(*puVar25,*(undefined1 *)((long)puVar25 + -1));
              puVar36[-2] = (uchar)((ulong)((uVar4 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)(((uVar4 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)(((uVar4 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar36 = puVar36 + uVar19;
              puVar25 = (undefined2 *)((long)puVar25 + 3);
            }
          }
          else {
            puVar36 = __s + uStack_13070 + 2;
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              uVar12 = (uint)*(byte *)((long)puVar24 + 2) |
                       (uint)*(byte *)((long)puVar24 + 1) << 8 | (uint)(byte)*puVar24 << 0x10;
              puVar36[-2] = (uchar)((ulong)((uVar12 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)(((uVar12 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)(((uVar12 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar24 = (uint *)((long)puVar24 + 3);
              puVar36 = puVar36 + uVar19;
            }
          }
          break;
        case 6:
          iVar35 = *piVar8;
          if (piVar8[6] == 0) {
            puVar36 = __s + uStack_13070 + 2;
            lVar26 = lVar26 + iVar31 * iStack_13098 + 2;
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              iVar31 = *(int *)(lVar26 + -2);
              puVar36[-2] = (uchar)((ulong)((iVar31 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)(((iVar31 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)(((iVar31 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar36 = puVar36 + uVar19;
              lVar26 = lVar26 + 4;
            }
          }
          else {
            puVar36 = __s + uStack_13070 + 2;
            for (; 0 < iVar35; iVar35 = iVar35 + -1) {
              uVar12 = *puVar24;
              uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
              puVar36[-2] = (uchar)((ulong)(((int)uVar12 >> (bVar20 & 0x1f) & uVar33) * 0xff) /
                                   (uVar23 & 0xffffffff));
              puVar36[-1] = (uchar)((((int)uVar12 >> (bVar21 & 0x1f) & uVar27) * 0xff) / uVar27);
              *puVar36 = (uchar)((((int)uVar12 >> (bVar22 & 0x1f) & uVar28) * 0xff) / uVar28);
              puVar24 = puVar24 + 1;
              puVar36 = puVar36 + uVar19;
            }
          }
        }
      }
      uStack_13070 = (ulong)((int)uStack_13070 + uVar19 * iVar34);
    }
  }
  (**(code **)(piVar8 + 0x18))(piVar8);
  return puStack_13058;
}

Assistant:

static uchar *read_win_rectangle(uchar *p, int X, int Y, int w, int h, int alpha)
{
  XImage	*image;		// Captured image
  int		i, maxindex;	// Looping vars
  int           x, y;		// Current X & Y in image
  int		d;		// Depth of image
  unsigned char *line,		// Array to hold image row
		*line_ptr;	// Pointer to current line image
  unsigned char	*pixel;		// Current color value
  XColor	colors[4096];	// Colors from the colormap...
  unsigned char	cvals[4096][3];	// Color values from the colormap...
  unsigned	index_mask,
		index_shift,
		red_mask,
		red_shift,
		green_mask,
		green_shift,
		blue_mask,
		blue_shift;


  //
  // Under X11 we have the option of the XGetImage() interface or SGI's
  // ReadDisplay extension which does all of the really hard work for
  // us...
  //
  int allow_outside = w < 0;    // negative w allows negative X or Y, that is, window frame
  if (w < 0) w = - w;

#  ifdef __sgi
  if (XReadDisplayQueryExtension(fl_display, &i, &i)) {
    image = XReadDisplay(fl_display, fl_window, X, Y, w, h, 0, NULL);
  } else
#  else
  image = 0;
#  endif // __sgi

  if (!image) {
    // fetch absolute coordinates
    int dx, dy, sx, sy, sw, sh;
    Window child_win;
    
    Fl_Window *win;
    if (allow_outside) win = (Fl_Window*)1;
    else win = fl_find(fl_window);
    if (win) {
      XTranslateCoordinates(fl_display, fl_window,
          RootWindow(fl_display, fl_screen), X, Y, &dx, &dy, &child_win);
      // screen dimensions
      Fl::screen_xywh(sx, sy, sw, sh, fl_screen);
    }
    if (!win || (dx >= sx && dy >= sy && dx + w <= sx+sw && dy + h <= sy+sh)) {
      // the image is fully contained, we can use the traditional method
      // however, if the window is obscured etc. the function will still fail. Make sure we
      // catch the error and continue, otherwise an exception will be thrown.
      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      image = XGetImage(fl_display, fl_window, X, Y, w, h, AllPlanes, ZPixmap);
      XSetErrorHandler(old_handler);
    } else {
      // image is crossing borders, determine visible region
      int nw, nh, noffx, noffy;
      noffx = fl_subimage_offsets(sx, sw, dx, w, nw);
      noffy = fl_subimage_offsets(sy, sh, dy, h, nh);
      if (nw <= 0 || nh <= 0) return 0;

      // allocate the image
      int bpp = fl_visual->depth + ((fl_visual->depth / 8) % 2) * 8;
      char* buf = (char*)malloc(bpp / 8 * w * h);
      image = XCreateImage(fl_display, fl_visual->visual,
	  fl_visual->depth, ZPixmap, 0, buf, w, h, bpp, 0);
      if (!image) {
	if (buf) free(buf);
	return 0;
      }

      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      XImage *subimg = XGetSubImage(fl_display, fl_window, X + noffx, Y + noffy,
                                    nw, nh, AllPlanes, ZPixmap, image, noffx, noffy);
      XSetErrorHandler(old_handler);
      if (!subimg) {
        XDestroyImage(image);
        return 0;
      }
    }
  }

  if (!image) return 0;

#ifdef DEBUG
  printf("width            = %d\n", image->width);
  printf("height           = %d\n", image->height);
  printf("xoffset          = %d\n", image->xoffset);
  printf("format           = %d\n", image->format);
  printf("data             = %p\n", image->data);
  printf("byte_order       = %d\n", image->byte_order);
  printf("bitmap_unit      = %d\n", image->bitmap_unit);
  printf("bitmap_bit_order = %d\n", image->bitmap_bit_order);
  printf("bitmap_pad       = %d\n", image->bitmap_pad);
  printf("depth            = %d\n", image->depth);
  printf("bytes_per_line   = %d\n", image->bytes_per_line);
  printf("bits_per_pixel   = %d\n", image->bits_per_pixel);
  printf("red_mask         = %08x\n", image->red_mask);
  printf("green_mask       = %08x\n", image->green_mask);
  printf("blue_mask        = %08x\n", image->blue_mask);
  printf("map_entries      = %d\n", fl_visual->visual->map_entries);
#endif // DEBUG

  d = alpha ? 4 : 3;

  // Allocate the image data array as needed...
  if (!p) p = new uchar[w * h * d];

  // Initialize the default colors/alpha in the whole image...
  memset(p, alpha, w * h * d);

  // Check that we have valid mask/shift values...
  if (!image->red_mask && image->bits_per_pixel > 12) {
    // Greater than 12 bits must be TrueColor...
    image->red_mask   = fl_visual->visual->red_mask;
    image->green_mask = fl_visual->visual->green_mask;
    image->blue_mask  = fl_visual->visual->blue_mask;

#ifdef DEBUG
    puts("\n---- UPDATED ----");
    printf("fl_redmask       = %08x\n", fl_redmask);
    printf("fl_redshift      = %d\n", fl_redshift);
    printf("fl_greenmask     = %08x\n", fl_greenmask);
    printf("fl_greenshift    = %d\n", fl_greenshift);
    printf("fl_bluemask      = %08x\n", fl_bluemask);
    printf("fl_blueshift     = %d\n", fl_blueshift);
    printf("red_mask         = %08x\n", image->red_mask);
    printf("green_mask       = %08x\n", image->green_mask);
    printf("blue_mask        = %08x\n", image->blue_mask);
#endif // DEBUG
  }

  // Check if we have colormap image...
  if (!image->red_mask) {
    // Get the colormap entries for this window...
    maxindex = fl_visual->visual->map_entries;

    for (i = 0; i < maxindex; i ++) colors[i].pixel = i;

    XQueryColors(fl_display, fl_colormap, colors, maxindex);

    for (i = 0; i < maxindex; i ++) {
      cvals[i][0] = colors[i].red >> 8;
      cvals[i][1] = colors[i].green >> 8;
      cvals[i][2] = colors[i].blue >> 8;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 1 :
	  for (x = image->width, line_ptr = line, index_mask = 128;
	       x > 0;
	       x --, line_ptr += d) {
	    if (*pixel & index_mask) {
	      line_ptr[0] = cvals[1][0];
	      line_ptr[1] = cvals[1][1];
	      line_ptr[2] = cvals[1][2];
            } else {
	      line_ptr[0] = cvals[0][0];
	      line_ptr[1] = cvals[0][1];
	      line_ptr[2] = cvals[0][2];
            }

            if (index_mask > 1) {
	      index_mask >>= 1;
	    } else {
              index_mask = 128;
              pixel ++;
            }
	  }
          break;

        case 2 :
	  for (x = image->width, line_ptr = line, index_shift = 6;
	       x > 0;
	       x --, line_ptr += d) {
	    i = (*pixel >> index_shift) & 3;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_mask >>= 2;
              index_shift -= 2;
            } else {
              index_mask  = 192;
              index_shift = 6;
              pixel ++;
            }
	  }
          break;

        case 4 :
	  for (x = image->width, line_ptr = line, index_shift = 4;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 4) i = (*pixel >> 4) & 15;
	    else i = *pixel & 15;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_shift = 0;
	    } else {
              index_shift = 4;
              pixel ++;
            }
	  }
          break;

        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    line_ptr[0] = cvals[*pixel][0];
	    line_ptr[1] = cvals[*pixel][1];
	    line_ptr[2] = cvals[*pixel][2];
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
	    }

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;
      }
    }
  } else {
    // RGB(A) image, so figure out the shifts & masks...
    red_mask  = image->red_mask;
    red_shift = 0;

    while ((red_mask & 1) == 0) {
      red_mask >>= 1;
      red_shift ++;
    }

    green_mask  = image->green_mask;
    green_shift = 0;

    while ((green_mask & 1) == 0) {
      green_mask >>= 1;
      green_shift ++;
    }

    blue_mask  = image->blue_mask;
    blue_shift = 0;

    while ((blue_mask & 1) == 0) {
      blue_mask >>= 1;
      blue_shift ++;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    i = *pixel;

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
            }

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;

        case 16 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[1] << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[0] << 8) | pixel[1];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 24 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[2] << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[0] << 8) | pixel[1]) << 8) | pixel[2];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 32 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[3] << 8) | pixel[2]) << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[0] << 8) | pixel[1]) << 8) | pixel[2]) << 8) | pixel[3];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;
      }
    }
  }

  // Destroy the X image we've read and return the RGB(A) image...
  XDestroyImage(image);

  return p;
}